

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_bind_value(sqlite3_stmt *pStmt,int i,sqlite3_value *pValue)

{
  int iVar1;
  char *zData;
  Vdbe *p;
  u8 encoding;
  
  switch(pValue->type) {
  case '\x01':
    iVar1 = sqlite3_bind_int64(pStmt,i,(pValue->u).i);
    return iVar1;
  case '\x02':
    iVar1 = sqlite3_bind_double(pStmt,i,pValue->r);
    return iVar1;
  case '\x03':
    zData = pValue->z;
    iVar1 = pValue->n;
    encoding = pValue->enc;
    break;
  case '\x04':
    if ((pValue->flags & 0x4000) != 0) {
      iVar1 = sqlite3_bind_zeroblob(pStmt,i,(pValue->u).nZero);
      return iVar1;
    }
    zData = pValue->z;
    iVar1 = pValue->n;
    encoding = '\0';
    break;
  default:
    iVar1 = vdbeUnbind((Vdbe *)pStmt,i);
    if (iVar1 == 0) {
      iVar1 = 0;
      if (*(sqlite3_mutex **)(*(long *)pStmt + 0x18) != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(*(long *)pStmt + 0x18));
      }
    }
    return iVar1;
  }
  iVar1 = bindText(pStmt,i,zData,iVar1,(_func_void_void_ptr *)0xffffffffffffffff,encoding);
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_bind_value(sqlite3_stmt *pStmt, int i, const sqlite3_value *pValue){
  int rc;
  switch( pValue->type ){
    case SQLITE_INTEGER: {
      rc = sqlite3_bind_int64(pStmt, i, pValue->u.i);
      break;
    }
    case SQLITE_FLOAT: {
      rc = sqlite3_bind_double(pStmt, i, pValue->r);
      break;
    }
    case SQLITE_BLOB: {
      if( pValue->flags & MEM_Zero ){
        rc = sqlite3_bind_zeroblob(pStmt, i, pValue->u.nZero);
      }else{
        rc = sqlite3_bind_blob(pStmt, i, pValue->z, pValue->n,SQLITE_TRANSIENT);
      }
      break;
    }
    case SQLITE_TEXT: {
      rc = bindText(pStmt,i,  pValue->z, pValue->n, SQLITE_TRANSIENT,
                              pValue->enc);
      break;
    }
    default: {
      rc = sqlite3_bind_null(pStmt, i);
      break;
    }
  }
  return rc;
}